

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity
          (VolumeMeshVertexColorQuantity *this,string *name,VolumeMesh *mesh_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_)

{
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  std::__cxx11::string::string((string *)&local_58,"vertex",&local_59);
  VolumeMeshColorQuantity::VolumeMeshColorQuantity
            (&this->super_VolumeMeshColorQuantity,&local_38,mesh_,&local_58,values_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_VolumeMeshColorQuantity).super_VolumeMeshQuantity.
  super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__VolumeMeshColorQuantity_00598a40;
  VolumeMesh::refreshVolumeMeshListeners
            ((this->super_VolumeMeshColorQuantity).super_VolumeMeshQuantity.
             super_QuantityS<polyscope::VolumeMesh>.parent);
  return;
}

Assistant:

VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity(std::string name, VolumeMesh& mesh_,
                                                             const std::vector<glm::vec3>& values_)
    : VolumeMeshColorQuantity(name, mesh_, "vertex", values_)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}